

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O1

TimingControl *
slang::ast::EventListControl::fromSyntax
          (Compilation *compilation,SyntaxNode *syntax,ASTContext *context)

{
  int iVar1;
  undefined4 extraout_var;
  EventListControl *pEVar2;
  EVP_PKEY_CTX *src;
  long lVar3;
  SmallVector<slang::ast::TimingControl_*,_5UL> events;
  span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> local_90;
  SmallVectorBase<slang::ast::TimingControl_*> local_80 [2];
  SourceRange local_40;
  
  local_80[0].data_ = (pointer)local_80[0].firstElement;
  local_80[0].len = 0;
  local_80[0].cap = 5;
  collectEvents(context,syntax,local_80);
  if (local_80[0].len == 1) {
    pEVar2 = (EventListControl *)*local_80[0].data_;
  }
  else {
    iVar1 = SmallVectorBase<slang::ast::TimingControl_*>::copy
                      (local_80,(EVP_PKEY_CTX *)compilation,src);
    local_90._M_ptr = (pointer)CONCAT44(extraout_var,iVar1);
    local_40 = slang::syntax::SyntaxNode::sourceRange(syntax);
    pEVar2 = BumpAllocator::
             emplace<slang::ast::EventListControl,std::span<slang::ast::TimingControl_const*const,18446744073709551615ul>,slang::SourceRange>
                       (&compilation->super_BumpAllocator,&local_90,&local_40);
    if (local_80[0].len != 0) {
      lVar3 = 0;
      do {
        if (**(int **)((long)local_80[0].data_ + lVar3) == 0) {
          local_90._M_ptr = (pointer)pEVar2;
          pEVar2 = (EventListControl *)
                   BumpAllocator::
                   emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                             (&compilation->super_BumpAllocator,(TimingControl **)&local_90);
          break;
        }
        lVar3 = lVar3 + 8;
      } while (local_80[0].len << 3 != lVar3);
    }
  }
  if (local_80[0].data_ != (pointer)local_80[0].firstElement) {
    operator_delete(local_80[0].data_);
  }
  return &pEVar2->super_TimingControl;
}

Assistant:

TimingControl& EventListControl::fromSyntax(Compilation& compilation, const SyntaxNode& syntax,
                                            const ASTContext& context) {
    SmallVector<TimingControl*> events;
    collectEvents(context, syntax, events);

    if (events.size() == 1)
        return *events[0];

    auto result = compilation.emplace<EventListControl>(events.ccopy(compilation),
                                                        syntax.sourceRange());
    for (auto ev : events) {
        if (ev->bad())
            return badCtrl(compilation, result);
    }

    return *result;
}